

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_coding.c
# Opt level: O2

void WebRtcIsac_Lar2Poly(double *lars,double *lowband,int orderLo,double *hiband,int orderHi,
                        int Nsub)

{
  int iVar1;
  bool bVar2;
  double rc [100];
  double local_358 [101];
  
  iVar1 = 0;
  if (0 < Nsub) {
    iVar1 = Nsub;
  }
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    WebRtcIsac_Lar2Rc(lars + 2,local_358,orderLo);
    WebRtcIsac_Rc2Poly(local_358,orderLo,lowband);
    WebRtcIsac_Lar2Rc(lars + (orderLo + 2),local_358,orderHi);
    WebRtcIsac_Rc2Poly(local_358,orderHi,hiband);
    *lowband = *lars;
    *hiband = lars[1];
    lowband = lowband + (orderLo + 1);
    hiband = hiband + (orderHi + 1);
    lars = lars + (orderLo + 2 + orderHi);
  }
  return;
}

Assistant:

void WebRtcIsac_Lar2Poly(double* lars, double* lowband, int orderLo,
                         double* hiband, int orderHi, int Nsub) {
  int k, orderTot;
  double rc[MAX_ORDER], *outpl, *outph, *inp;

  orderTot = (orderLo + orderHi + 2);
  outpl = lowband;
  outph = hiband;
  /* First two elements of 'inp' store gains*/
  inp = lars;
  for (k = 0; k < Nsub; k++) {
    /* Low band */
    WebRtcIsac_Lar2Rc(&inp[2], rc, orderLo);
    WebRtcIsac_Rc2Poly(rc, orderLo, outpl);

    /* High band */
    WebRtcIsac_Lar2Rc(&inp[orderLo + 2], rc, orderHi);
    WebRtcIsac_Rc2Poly(rc, orderHi, outph);

    /* gains */
    outpl[0] = inp[0];
    outph[0] = inp[1];

    outpl += orderLo + 1;
    outph += orderHi + 1;
    inp += orderTot;
  }
}